

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O1

void __thiscall
spectest::CommandRunner::PopulateImports(CommandRunner *this,Ptr *module,RefVec *imports)

{
  string *psVar1;
  iterator __position;
  string *module_00;
  Ptr extern_;
  Ptr local_58;
  Ref local_38;
  
  module_00 = (string *)
              (module->obj_->desc_).imports.
              super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>
              ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (string *)
           (module->obj_->desc_).imports.
           super__Vector_base<wabt::interp::ImportDesc,_std::allocator<wabt::interp::ImportDesc>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (module_00 != psVar1) {
    do {
      GetImport(&local_58,this,module_00,module_00 + 1);
      if (local_58.obj_ == (Extern *)0x0) {
        local_38.index = 0;
      }
      else {
        local_38 = wabt::interp::RefPtr<wabt::interp::Extern>::ref(&local_58);
      }
      __position._M_current =
           (imports->super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (imports->super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>::
        _M_realloc_insert<wabt::interp::Ref_const&>
                  ((vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)imports,__position
                   ,&local_38);
      }
      else {
        (__position._M_current)->index = local_38.index;
        (imports->super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>)._M_impl
        .super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      if (local_58.obj_ != (Extern *)0x0) {
        wabt::interp::Store::DeleteRoot(local_58.store_,local_58.root_index_);
        local_58.obj_ = (Extern *)0x0;
        local_58.store_ = (Store *)0x0;
        local_58.root_index_ = 0;
      }
      module_00 = (string *)&module_00[2]._M_string_length;
    } while (module_00 != psVar1);
  }
  return;
}

Assistant:

void CommandRunner::PopulateImports(const interp::Module::Ptr& module,
                                    RefVec* imports) {
  for (auto&& import : module->desc().imports) {
    auto extern_ = GetImport(import.type.module, import.type.name);
    imports->push_back(extern_ ? extern_.ref() : Ref::Null);
  }
}